

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackOverflowQueryTests.cpp
# Opt level: O0

bool __thiscall
gl3cts::TransformFeedbackOverflowQueryFunctionalBase::canTestStreamOverflow
          (TransformFeedbackOverflowQueryFunctionalBase *this)

{
  bool bVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  int local_24;
  long lStack_20;
  GLint counterBits;
  Functions *gl;
  TransformFeedbackOverflowQueryFunctionalBase *this_local;
  
  gl = (Functions *)this;
  bVar1 = TransformFeedbackOverflowQueryBaseTest::supportsTransformFeedback3
                    (&this->super_TransformFeedbackOverflowQueryBaseTest);
  if (bVar1) {
    pRVar3 = deqp::Context::getRenderContext
                       ((this->super_TransformFeedbackOverflowQueryBaseTest).super_TestCase.
                        m_context);
    iVar2 = (*pRVar3->_vptr_RenderContext[3])();
    lStack_20 = CONCAT44(extraout_var,iVar2);
    (**(code **)(lStack_20 + 0xa28))(0x82ed,0x8864,&local_24);
    this_local._7_1_ = 0 < local_24;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool canTestStreamOverflow()
	{
		if (supportsTransformFeedback3())
		{
			const glw::Functions& gl = m_context.getRenderContext().getFunctions();
			GLint				  counterBits;

			gl.getQueryiv(GL_TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB, GL_QUERY_COUNTER_BITS, &counterBits);

			return counterBits > 0;
		}
		else
		{
			return false;
		}
	}